

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O1

int __thiscall helics::ConnectorFederateManager::getFilterCount(ConnectorFederateManager *this)

{
  bool bVar1;
  size_t sVar2;
  pthread_rwlock_t *__rwlock;
  
  bVar1 = (this->filters).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->filters).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  sVar2 = (this->filters).m_obj.dataStorage.csize;
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return (int)sVar2;
}

Assistant:

int ConnectorFederateManager::getFilterCount() const
{
    return static_cast<int>(filters.lock_shared()->size());
}